

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cc
# Opt level: O1

bool __thiscall
uttamarin::App::RunOnLemmas
          (App *this,vector<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_> *lemma_jobs)

{
  int false_lemmas;
  pointer pLVar1;
  pointer pcVar2;
  TheoryPreprocessor *pTVar3;
  _Head_base<0UL,_uttamarin::LemmaProcessor_*,_false> _Var4;
  int iVar5;
  mapped_type *pmVar6;
  value_type lemma_job;
  string preprocessed_spthy_file;
  unordered_map<uttamarin::ProverResult,_int,_std::hash<uttamarin::ProverResult>,_std::equal_to<uttamarin::ProverResult>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>_>
  count_of;
  string local_100;
  string local_e0;
  undefined1 local_c0 [32];
  _Alloc_hider local_a0;
  char local_90 [16];
  TamarinHeuristic local_80;
  string local_78;
  _Hashtable<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  PrintHeader(this);
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  pLVar1 = (lemma_jobs->
           super__Vector_base<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((lemma_jobs->super__Vector_base<uttamarin::LemmaJob,_std::allocator<uttamarin::LemmaJob>_>).
      _M_impl.super__Vector_impl_data._M_finish == pLVar1) {
    local_c0._0_8_ = (ulong)(uint)local_c0._4_4_ << 0x20;
    pmVar6 = std::__detail::
             _Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_58,(key_type *)local_c0);
    iVar5 = *pmVar6;
    local_78._M_dataplus._M_p._0_4_ = 1;
    pmVar6 = std::__detail::
             _Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_58,(key_type *)&local_78);
    false_lemmas = *pmVar6;
    local_100._M_dataplus._M_p._0_4_ = 2;
    pmVar6 = std::__detail::
             _Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_58,(key_type *)&local_100);
    PrintFooter(this,iVar5,false_lemmas,*pmVar6,0);
    std::
    _Hashtable<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_58);
    return true;
  }
  local_c0._0_8_ = local_c0 + 0x10;
  pcVar2 = (pLVar1->spthy_file_path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,pcVar2,pcVar2 + (pLVar1->spthy_file_path_)._M_string_length);
  local_a0._M_p = local_90;
  pcVar2 = (pLVar1->lemma_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + (pLVar1->lemma_name_)._M_string_length);
  local_80 = pLVar1->heuristic_;
  pTVar3 = (this->theory_preprocessor_)._M_t.
           super___uniq_ptr_impl<uttamarin::TheoryPreprocessor,_std::default_delete<uttamarin::TheoryPreprocessor>_>
           ._M_t.
           super__Tuple_impl<0UL,_uttamarin::TheoryPreprocessor_*,_std::default_delete<uttamarin::TheoryPreprocessor>_>
           .super__Head_base<0UL,_uttamarin::TheoryPreprocessor_*,_false>._M_head_impl;
  LemmaJob::GetSpthyFilePath_abi_cxx11_(&local_100,(LemmaJob *)local_c0);
  LemmaJob::GetLemmaName_abi_cxx11_(&local_e0,(LemmaJob *)local_c0);
  (*pTVar3->_vptr_TheoryPreprocessor[2])(&local_78,pTVar3,&local_100,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_100._M_dataplus._M_p._4_4_,local_100._M_dataplus._M_p._0_4_) !=
      &local_100.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_100._M_dataplus._M_p._4_4_,local_100._M_dataplus._M_p._0_4_),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  LemmaJob::SetSpthyFilePath((LemmaJob *)local_c0,&local_78);
  _Var4._M_head_impl =
       (this->lemma_processor_)._M_t.
       super___uniq_ptr_impl<uttamarin::LemmaProcessor,_std::default_delete<uttamarin::LemmaProcessor>_>
       ._M_t.
       super__Tuple_impl<0UL,_uttamarin::LemmaProcessor_*,_std::default_delete<uttamarin::LemmaProcessor>_>
       .super__Head_base<0UL,_uttamarin::LemmaProcessor_*,_false>._M_head_impl;
  iVar5 = (*(_Var4._M_head_impl)->_vptr_LemmaProcessor[2])(_Var4._M_head_impl,local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
      &local_78.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_),
                    local_78.field_2._M_allocated_capacity + 1);
  }
  LemmaJob::~LemmaJob((LemmaJob *)local_c0);
  std::
  _Hashtable<uttamarin::ProverResult,_std::pair<const_uttamarin::ProverResult,_int>,_std::allocator<std::pair<const_uttamarin::ProverResult,_int>_>,_std::__detail::_Select1st,_std::equal_to<uttamarin::ProverResult>,_std::hash<uttamarin::ProverResult>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_58);
  _Unwind_Resume(iVar5);
}

Assistant:

bool App::RunOnLemmas(const vector<LemmaJob>& lemma_jobs) {
  PrintHeader();

  bool success = true;
  unordered_map<ProverResult, int> count_of;
  int overall_duration = 0;

  for(int i=0;i < lemma_jobs.size();i++) {
    auto lemma_job = lemma_jobs[i];
    auto preprocessed_spthy_file =
            theory_preprocessor_->PreprocessAndReturnPathToResultingFile(
                    lemma_job.GetSpthyFilePath(), lemma_job.GetLemmaName());

    lemma_job.SetSpthyFilePath(preprocessed_spthy_file);
    auto output = lemma_processor_->ProcessLemma(lemma_job);

    PrintLemmaResults(lemma_job, output, i+1, lemma_jobs.size());

    overall_duration += output.duration;
    count_of[output.result]++;
    std::remove(preprocessed_spthy_file.c_str());
    if(output.result != ProverResult::True) {
      success = false;
      if(config_->IsAbortAfterFailure()) break;
    }
  }

  PrintFooter(count_of[ProverResult::True], count_of[ProverResult::False],
              count_of[ProverResult::Unknown], overall_duration);

  return success;
}